

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O0

uint8_t __thiscall lsim::SimCircuit::read_byte(SimCircuit *this,uint32_t comp_id)

{
  Simulator *this_00;
  uint32_t index;
  pin_t pin;
  Value VVar1;
  SimComponent *this_01;
  size_t sVar2;
  uint32_t local_28;
  byte local_21;
  int i;
  uint8_t result;
  SimComponent *comp;
  uint32_t comp_id_local;
  SimCircuit *this_local;
  
  this_01 = component_by_id(this,comp_id);
  if (this_01 == (SimComponent *)0x0) {
    __assert_fail("comp",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0x6a,"uint8_t lsim::SimCircuit::read_byte(uint32_t)");
  }
  sVar2 = SimComponent::num_inputs(this_01);
  if (sVar2 == 8) {
    local_21 = 0;
    local_28 = 0;
    while( true ) {
      sVar2 = SimComponent::num_inputs(this_01);
      if (sVar2 <= (ulong)(long)(int)local_28) break;
      this_00 = this->m_sim;
      index = SimComponent::input_pin_index(this_01,local_28);
      pin = SimComponent::pin_by_index(this_01,index);
      VVar1 = Simulator::read_pin(this_00,pin);
      local_21 = local_21 | (byte)(VVar1 << ((byte)local_28 & 0x1f));
      local_28 = local_28 + 1;
    }
    return local_21;
  }
  __assert_fail("comp->num_inputs() == 8",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x6c,"uint8_t lsim::SimCircuit::read_byte(uint32_t)");
}

Assistant:

uint8_t SimCircuit::read_byte(uint32_t comp_id) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    assert(comp->num_inputs() == 8);
    uint8_t result = 0;

    for (int i = 0; i < comp->num_inputs(); ++i) {
        result |= ((int) m_sim->read_pin(comp->pin_by_index(comp->input_pin_index(i)))) << i;
    }

    return result;
}